

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  char cVar1;
  bool bVar2;
  uchar uVar3;
  CURLcode CVar4;
  size_t sVar5;
  uchar *puVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  size_t padding;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char cVar13;
  ulong uVar14;
  size_t sVar15;
  uchar *puVar16;
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar5 = strlen(src);
  CVar4 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar5 & 3) == 0 && sVar5 != 0) {
    for (lVar11 = 0; src[lVar11] != '\0'; lVar11 = lVar11 + 1) {
      if (src[lVar11] == '=') {
        lVar7 = (ulong)(src[lVar11 + 1] == '=') + 1;
        goto LAB_004a5064;
      }
    }
    lVar7 = 0;
LAB_004a5064:
    if (sVar5 - lVar7 == lVar11) {
      uVar14 = sVar5 >> 2;
      sVar15 = uVar14 * 3 - lVar7;
      puVar6 = (uchar *)(*Curl_cmalloc)(sVar15 + 1);
      if (puVar6 == (uchar *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar11 = 0;
        puVar16 = puVar6;
        do {
          uVar9 = 0;
          lVar7 = 0;
          uVar10 = 0;
          pcVar8 = src;
          do {
            cVar1 = *pcVar8;
            if (cVar1 == '=') {
              uVar9 = uVar9 << 6;
              uVar10 = uVar10 + 1;
LAB_004a510b:
              bVar2 = true;
            }
            else {
              lVar12 = 0;
              if (cVar1 == 'A') {
                cVar13 = 'A';
              }
              else {
                do {
                  cVar13 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar12 + 1];
                  lVar12 = lVar12 + 1;
                  if (cVar13 == '\0') break;
                } while (cVar13 != cVar1);
              }
              if (cVar13 == cVar1) {
                uVar9 = uVar9 * 0x40 + lVar12;
                goto LAB_004a510b;
              }
              bVar2 = false;
            }
            if (!bVar2) {
              lVar7 = 0;
              goto LAB_004a5164;
            }
            lVar7 = lVar7 + 1;
            pcVar8 = pcVar8 + 1;
          } while (lVar7 != 4);
          if (uVar10 == 0) {
            uVar3 = curlx_ultouc(uVar9 & 0xff);
            puVar16[2] = uVar3;
          }
          if (uVar10 < 2) {
            uVar3 = curlx_ultouc(uVar9 >> 8 & 0xff);
            puVar16[1] = uVar3;
          }
          uVar3 = curlx_ultouc((ulong)((uint)uVar9 >> 0x10 & 0xff));
          *puVar16 = uVar3;
          lVar7 = 3 - uVar10;
LAB_004a5164:
          if (lVar7 == 0) {
            (*Curl_cfree)(puVar6);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar16 = puVar16 + lVar7;
          src = src + 4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != uVar14 + (uVar14 == 0));
        *puVar16 = '\0';
        *outptr = puVar6;
        *outlen = sVar15;
        CVar4 = CURLE_OK;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t length = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  while((src[length] != '=') && src[length])
    length++;

  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    padding++;
    if(src[length + 1] == '=')
      padding++;
  }

  /* Check the = padding characters weren't part way through the input */
  if(length + padding != srclen)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a zero terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}